

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QPoint *p)

{
  QPoint *point;
  QDebugStateSaver *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff9f;
  QDebugStateSaver *in_stack_ffffffffffffffa0;
  Stream *pSVar1;
  QDebug *in_stack_ffffffffffffffc8;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  pSVar1 = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_RSI,(QDebug *)in_RDI);
  QDebug::nospace((QDebug *)in_RSI);
  point = (QPoint *)QDebug::operator<<(in_stack_ffffffffffffffc8,t);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  QtDebugUtils::formatQPoint<QPoint>((QDebug *)in_RDI,point);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)point);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffffa0);
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return (QDebug)pSVar1;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPoint &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QPoint" << '(';
    QtDebugUtils::formatQPoint(dbg, p);
    dbg << ')';
    return dbg;
}